

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_transaction.cpp
# Opt level: O2

RawTransactionResponseStruct *
cfd::js::api::TransactionStructApi::AddScriptHashSign
          (RawTransactionResponseStruct *__return_storage_ptr__,
          AddScriptHashSignRequestStruct *request)

{
  string *in_R8;
  allocator local_119;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddScriptHashSignRequestStruct_&)>
  local_f8;
  RawTransactionResponseStruct local_d8;
  
  RawTransactionResponseStruct::RawTransactionResponseStruct(__return_storage_ptr__);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddScriptHashSignRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_transaction.cpp:509:20)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddScriptHashSignRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_transaction.cpp:509:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_f8,"AddScriptHashSign",&local_119);
  ExecuteStructApi<cfd::js::api::AddScriptHashSignRequestStruct,cfd::js::api::RawTransactionResponseStruct>
            (&local_d8,(api *)request,(AddScriptHashSignRequestStruct *)&local_118,&local_f8,in_R8);
  RawTransactionResponseStruct::operator=(__return_storage_ptr__,&local_d8);
  RawTransactionResponseStruct::~RawTransactionResponseStruct(&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  return __return_storage_ptr__;
}

Assistant:

RawTransactionResponseStruct TransactionStructApi::AddScriptHashSign(
    const AddScriptHashSignRequestStruct& request) {
  auto call_func = [](const AddScriptHashSignRequestStruct& request)
      -> RawTransactionResponseStruct {  // NOLINT
    RawTransactionResponseStruct response;

    TransactionContext ctx(request.tx);
    OutPoint outpoint(Txid(request.txin.txid), request.txin.vout);
    Script redeem_script(request.txin.redeem_script);
    AddressType addr_type =
        AddressApiBase::ConvertAddressType(request.txin.hash_type);
    std::vector<SignParameter> signatures;
    const auto& params = (request.txin.sign_params.empty())
                             ? request.txin.sign_param
                             : request.txin.sign_params;
    for (const auto& sign_data : params) {
      SignParameter signature =
          TransactionStructApiBase::ConvertSignDataStructToSignParameter(
              sign_data);  // NOLINT
      signatures.emplace_back(signature);
    }

    ctx.AddScriptHashSign(
        outpoint, signatures, redeem_script, addr_type,
        redeem_script.IsMultisigScript());
    response.hex = ctx.GetHex();
    return response;
  };

  RawTransactionResponseStruct result;
  result = ExecuteStructApi<
      AddScriptHashSignRequestStruct, RawTransactionResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}